

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_member_dereference(dmr_C *C,expression *expr)

{
  expression_list *expr_00;
  ident *ident_00;
  expression *C_00;
  int iVar1;
  symbol *psVar2;
  char *pcVar3;
  char *pcVar4;
  dmr_C *sym;
  expression *peVar5;
  uint local_6c;
  char *pcStack_68;
  int namelen;
  char *name;
  char *type;
  int address_space;
  uint mod;
  ident *ident;
  expression *add;
  expression *deref;
  symbol *member;
  symbol *ctype;
  expression *peStack_20;
  int offset;
  expression *expr_local;
  dmr_C *C_local;
  
  expr_00 = (expr->field_5).expr_list;
  ident_00 = (expr->field_5).field_4.symbol_name;
  peStack_20 = expr;
  expr_local = (expression *)C;
  psVar2 = dmrC_evaluate_expression(C,(expression *)expr_00);
  if (psVar2 == (symbol *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else if (ident_00 == (ident *)0x0) {
    dmrC_expression_error((dmr_C *)expr_local,peStack_20,"bad member name");
    C_local = (dmr_C *)0x0;
  }
  else {
    member = (symbol *)expr_00->next_;
    dmrC_examine_symbol_type((global_symbols_t *)expr_local->pos,member);
    type._0_4_ = *(uint *)(((expression_list *)member)->list_ + 0xb);
    type._4_4_ = (uint)((expression_list *)member)->list_[8];
    if (((undefined1  [264])*(expression_list *)member & (undefined1  [264])0xff) ==
        (undefined1  [264])0x3) {
      member = (symbol *)((expression_list *)member)->list_[0xc];
      type._0_4_ = *(uint *)((long)&member->field_14 + 0x30) | (uint)type;
      type._4_4_ = type._4_4_ | (uint)(member->field_14).field_2.ctype.modifiers;
    }
    if ((member == (symbol *)0x0) ||
       ((((undefined1  [232])*member & (undefined1  [232])0xff) != (undefined1  [232])0x7 &&
        (((undefined1  [232])*member & (undefined1  [232])0xff) != (undefined1  [232])0x8)))) {
      dmrC_expression_error((dmr_C *)expr_local,peStack_20,"expected structure or union");
      C_local = (dmr_C *)0x0;
    }
    else {
      ctype._4_4_ = 0;
      psVar2 = find_identifier((dmr_C *)expr_local,ident_00,(member->field_14).field_2.symbol_list,
                               (int *)((long)&ctype + 4));
      C_00 = expr_local;
      peVar5 = peStack_20;
      if (psVar2 == (symbol *)0x0) {
        pcVar3 = "union";
        if (((undefined1  [232])*member & (undefined1  [232])0xff) == (undefined1  [232])0x7) {
          pcVar3 = "struct";
        }
        pcStack_68 = "<unnamed>";
        local_6c = 9;
        if (member->ident != (ident *)0x0) {
          pcStack_68 = &member->ident->field_0x12;
          local_6c = (uint)member->ident->len;
        }
        if ((member->field_14).field_2.symbol_list == (symbol_list *)0x0) {
          pcVar4 = dmrC_show_ident((dmr_C *)expr_local,ident_00);
          dmrC_expression_error
                    ((dmr_C *)C_00,peVar5,"using member \'%s\' in incomplete %s %.*s",pcVar4,pcVar3,
                     (ulong)local_6c,pcStack_68);
        }
        else {
          pcVar4 = dmrC_show_ident((dmr_C *)expr_local,ident_00);
          dmrC_expression_error
                    ((dmr_C *)C_00,peVar5,"no member \'%s\' in %s %.*s",pcVar4,pcVar3,
                     (ulong)local_6c,pcStack_68);
        }
        C_local = (dmr_C *)0x0;
      }
      else {
        sym = (dmr_C *)convert_to_as_mod((dmr_C *)expr_local,psVar2,(uint)type,type._4_4_);
        dmrC_get_base_type((global_symbols_t *)expr_local->pos,(symbol *)sym);
        iVar1 = lvalue_expression((dmr_C *)expr_local,(expression *)expr_00);
        C_local = sym;
        if (iVar1 == 0) {
          if ((undefined1  [264])((undefined1  [264])*expr_00 & (undefined1  [264])0xff) ==
              (undefined1  [264])0x1d) {
            (peStack_20->field_5).field_0.value =
                 (((anon_union_32_18_55d8ca1e_for_expression_5 *)expr_00->list_)->field_0).value;
            (peStack_20->field_5).field_0.taint =
                 (((anon_union_32_18_55d8ca1e_for_expression_5 *)expr_00->list_)->field_0).taint;
          }
          else {
            (peStack_20->field_5).expr_list = expr_00;
            (peStack_20->field_5).field_0.taint = 0;
          }
          iVar1 = dmrC_bytes_to_bits(*(target_t **)expr_local,ctype._4_4_);
          (peStack_20->field_5).field_0.taint = iVar1 + (peStack_20->field_5).field_0.taint;
          *(ushort *)peStack_20 = *(ushort *)peStack_20 & 0xff00 | 0x1d;
          (peStack_20->field_5).field_8.r_nrbits = *(uint *)&(sym->ptrlist_allocator).freelist_;
          (peStack_20->field_5).field_0.taint =
               (*(uint *)((long)&(sym->ptrlist_allocator).freelist_ + 4) & 0xff) +
               (peStack_20->field_5).field_0.taint;
          peStack_20->ctype = (symbol *)sym;
        }
        else {
          peVar5 = (((anon_union_32_18_55d8ca1e_for_expression_5 *)expr_00->list_)->field_3).unop;
          (peStack_20->field_5).field_3.unop = peVar5;
          peVar5 = evaluate_offset((dmr_C *)expr_local,peVar5,(long)ctype._4_4_);
          *(ushort *)peStack_20 = *(ushort *)peStack_20 & 0xff00 | 9;
          peStack_20->op = 0x2a;
          (peStack_20->field_5).field_3.unop = peVar5;
          peStack_20->ctype = (symbol *)sym;
        }
      }
    }
  }
  return (symbol *)C_local;
}

Assistant:

static struct symbol *evaluate_member_dereference(struct dmr_C *C, struct expression *expr)
{
	int offset;
	struct symbol *ctype, *member;
	struct expression *deref = expr->deref, *add;
	struct ident *ident = expr->member;
	unsigned int mod;
	int address_space;

	if (!dmrC_evaluate_expression(C, deref))
		return NULL;
	if (!ident) {
		dmrC_expression_error(C, expr, "bad member name");
		return NULL;
	}

	ctype = deref->ctype;
	dmrC_examine_symbol_type(C->S, ctype);
	address_space = ctype->ctype.as;
	mod = ctype->ctype.modifiers;
	if (ctype->type == SYM_NODE) {
		ctype = ctype->ctype.base_type;
		address_space |= ctype->ctype.as;
		mod |= ctype->ctype.modifiers;
	}
	if (!ctype || (ctype->type != SYM_STRUCT && ctype->type != SYM_UNION)) {
		dmrC_expression_error(C, expr, "expected structure or union");
		return NULL;
	}
	offset = 0;
	member = find_identifier(C, ident, ctype->symbol_list, &offset);
	if (!member) {
		const char *type = ctype->type == SYM_STRUCT ? "struct" : "union";
		const char *name = "<unnamed>";
		int namelen = 9;
		if (ctype->ident) {
			name = ctype->ident->name;
			namelen = ctype->ident->len;
		}
		if (ctype->symbol_list)
			dmrC_expression_error(C, expr, "no member '%s' in %s %.*s",
				dmrC_show_ident(C, ident), type, namelen, name);
		else
			dmrC_expression_error(C, expr, "using member '%s' in "
				"incomplete %s %.*s", dmrC_show_ident(C, ident),
				type, namelen, name);
		return NULL;
	}

	/*
	 * The member needs to take on the address space and modifiers of
	 * the "parent" type.
	 */
	member = convert_to_as_mod(C, member, address_space, mod);
	ctype = dmrC_get_base_type(C->S, member);

	if (!lvalue_expression(C, deref)) {
		if (deref->type != EXPR_SLICE) {
			expr->base = deref;
			expr->r_bitpos = 0;
		} else {
			expr->base = deref->base;
			expr->r_bitpos = deref->r_bitpos;
		}
		expr->r_bitpos += dmrC_bytes_to_bits(C->target, offset);
		expr->type = EXPR_SLICE;
		expr->r_nrbits = member->bit_size;
		expr->r_bitpos += member->bit_offset;
		expr->ctype = member;
		return member;
	}

	deref = deref->unop;
	expr->deref = deref;

	add = evaluate_offset(C, deref, offset);
	expr->type = EXPR_PREOP;
	expr->op = '*';
	expr->unop = add;

	expr->ctype = member;
	return member;
}